

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O1

void __thiscall TimerManager::addTimer(TimerManager *this,Timer *timer)

{
  uint uVar1;
  long lVar2;
  AutoLock l;
  AutoLock AStack_28;
  
  AutoLock::AutoLock(&AStack_28,&this->mMutex);
  uVar1 = (this->mTimers).mSize;
  if (uVar1 != 0) {
    lVar2 = 0;
    do {
      if ((this->mTimers).mData[lVar2] == timer) goto LAB_0012125f;
      lVar2 = lVar2 + 1;
    } while (uVar1 != (uint)lVar2);
  }
  if (uVar1 == (this->mTimers).mAllocated) {
    JetHead::vector<Timer_*>::sizeup(&this->mTimers,0);
  }
  uVar1 = (this->mTimers).mSize;
  (this->mTimers).mData[uVar1] = timer;
  (this->mTimers).mSize = uVar1 + 1;
LAB_0012125f:
  AutoLock::~AutoLock(&AStack_28);
  return;
}

Assistant:

void TimerManager::addTimer(Timer* timer)
{
	TRACE_BEGIN(LOG_LVL_NOISE);
	
	// Lock mutex while accessing/modifying mTimers vector
	AutoLock l(mMutex);
	
	// Search the vector of timers to see if the specified
	// timer is already present.   If it is then return
	// immediately.
	for (unsigned i = 0; i < mTimers.size(); ++i)
	{
		if (mTimers[i] == timer)
		{
			// Timer already in our vector so nothing to do
			return;
		}
	}
	
	mTimers.push_back(timer);
}